

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv.cc
# Opt level: O2

CalculatedFloat
absl::lts_20250127::anon_unknown_0::CalculatedFloatFromRawValues<double>
          (uint64_t mantissa,int exponent)

{
  uint64_t uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uint64_t uVar5;
  CalculatedFloat CVar6;
  
  uVar5 = 0x10000000000000;
  if (mantissa != 0x20000000000000) {
    uVar5 = mantissa;
  }
  uVar2 = (uint)(mantissa == 0x20000000000000) + exponent;
  uVar4 = 0xfffe7961;
  if (uVar5 != 0) {
    uVar4 = uVar2;
  }
  uVar3 = 99999;
  uVar1 = 0;
  if ((int)uVar2 < 0x3cc) {
    uVar3 = (ulong)uVar4;
    uVar1 = uVar5;
  }
  CVar6._8_8_ = uVar3;
  CVar6.mantissa = uVar1;
  return CVar6;
}

Assistant:

CalculatedFloat CalculatedFloatFromRawValues(uint64_t mantissa, int exponent) {
  CalculatedFloat result;
  if (mantissa == uint64_t{1} << FloatTraits<FloatType>::kTargetMantissaBits) {
    mantissa >>= 1;
    exponent += 1;
  }
  if (exponent > FloatTraits<FloatType>::kMaxExponent) {
    result.exponent = kOverflow;
  } else if (mantissa == 0) {
    result.exponent = kUnderflow;
  } else {
    result.exponent = exponent;
    result.mantissa = mantissa;
  }
  return result;
}